

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  Leaf *pLVar5;
  ulong uVar6;
  Maybe<unsigned_long> MVar7;
  Iterator iter;
  char *local_78;
  size_t sStack_70;
  Iterator local_68;
  StringPtr *local_50;
  long local_48;
  SearchKey local_40;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_38;
  StringPtr **local_30;
  undefined1 *local_28;
  
  local_28 = (undefined1 *)&local_78;
  if (skip != 0) {
    local_38 = &table->indexes;
    local_50 = (table->rows).builder.ptr;
    local_48 = (long)(table->rows).builder.pos - (long)local_50 >> 4;
    local_78 = (row->content).ptr;
    sStack_70 = (row->content).size_;
    local_30 = &local_50;
    local_40._vptr_SearchKey = (_func_int **)&PTR_search_001c0a40;
    _::BTreeImpl::insert(&local_68,(BTreeImpl *)&(table->indexes).erasedCount,&local_40);
    uVar6 = (ulong)local_68.row;
    if ((uVar6 == 0xe) || (uVar1 = (local_68.leaf)->rows[uVar6].i, uVar1 == 0)) {
LAB_00150c75:
      memmove((local_68.leaf)->rows + uVar6 + 1,(local_68.leaf)->rows + uVar6,
              (ulong)(local_68.row + 1) * -4 + 0x38);
      (local_68.leaf)->rows[uVar6].i = (int)pos + 1;
      bVar3 = false;
      pos = (size_t)extraout_RDX_00;
      pLVar5 = local_68.leaf;
    }
    else {
      pLVar5 = (Leaf *)(ulong)(uVar1 - 1);
      sVar2 = local_50[(long)pLVar5].content.size_;
      if (sVar2 != sStack_70) goto LAB_00150c75;
      iVar4 = bcmp(local_50[(long)pLVar5].content.ptr,local_78,sVar2 - 1);
      if (iVar4 != 0) goto LAB_00150c75;
      bVar3 = true;
      pos = (size_t)extraout_RDX;
    }
    if (bVar3) {
      *this = (Impl<0UL,_false>)0x1;
      *(Leaf **)(this + 8) = pLVar5;
      goto LAB_00150cb9;
    }
  }
  *this = (Impl<0UL,_false>)0x0;
LAB_00150cb9:
  MVar7.ptr.field_1.value = pos;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }